

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::EventLog::RecordJsRTSetException
          (EventLog *this,TTDJsRTActionResultAutoRecorder *actionPopper,Var var,
          bool propagateToDebugger)

{
  EventLogEntry *actionEvent;
  EventLogEntry *evt;
  JsRTSingleVarScalarArgumentAction *spAction;
  Var pvStack_20;
  bool propagateToDebugger_local;
  Var var_local;
  TTDJsRTActionResultAutoRecorder *actionPopper_local;
  EventLog *this_local;
  
  evt = (EventLogEntry *)0x0;
  spAction._7_1_ = propagateToDebugger;
  pvStack_20 = var;
  var_local = actionPopper;
  actionPopper_local = (TTDJsRTActionResultAutoRecorder *)this;
  actionEvent = RecordGetInitializedEvent<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)44>
                          (this,(JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> **)&evt);
  NSLogEvents::SetVarItem_0<1ul,1ul>
            ((JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *)evt,pvStack_20);
  NSLogEvents::SetScalarItem_0<1ul,1ul>
            ((JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *)evt,
             (ulong)(spAction._7_1_ & 1));
  TTDJsRTActionResultAutoRecorder::InitializeWithEventAndEnter
            ((TTDJsRTActionResultAutoRecorder *)var_local,actionEvent);
  return;
}

Assistant:

void EventLog::RecordJsRTSetException(TTDJsRTActionResultAutoRecorder& actionPopper, Js::Var var, bool propagateToDebugger)
    {
        NSLogEvents::JsRTSingleVarScalarArgumentAction* spAction = nullptr;
        NSLogEvents::EventLogEntry* evt = this->RecordGetInitializedEvent<NSLogEvents::JsRTSingleVarScalarArgumentAction, NSLogEvents::EventKind::SetExceptionActionTag>(&spAction);
        NSLogEvents::SetVarItem_0(spAction, TTD_CONVERT_JSVAR_TO_TTDVAR(var));
        NSLogEvents::SetScalarItem_0(spAction, propagateToDebugger);

        actionPopper.InitializeWithEventAndEnter(evt);
    }